

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong.cpp
# Opt level: O0

void __thiscall
vera::PingPong::allocate
          (PingPong *this,int _width,int _height,FboType _type,TextureFilter _filter,
          TextureWrap _wrap,bool _autoclear)

{
  int local_2c;
  int i;
  bool _autoclear_local;
  TextureWrap _wrap_local;
  TextureFilter _filter_local;
  FboType _type_local;
  int _height_local;
  int _width_local;
  PingPong *this_local;
  
  for (local_2c = 0; local_2c < 2; local_2c = local_2c + 1) {
    (**(code **)(*(long *)(&this->field_0x18 + (long)local_2c * 0x38) + 0x10))
              (&this->field_0x18 + (long)local_2c * 0x38,_width,_height,_type,_filter,_wrap,
               _autoclear);
  }
  (*this->_vptr_PingPong[4])(0);
  this->m_flag = 0;
  (*this->_vptr_PingPong[3])();
  return;
}

Assistant:

void PingPong::allocate(int _width, int _height, FboType _type, TextureFilter _filter, TextureWrap _wrap, bool _autoclear) {
    for(int i = 0; i < 2; i++)
        m_fbos[i].allocate(_width, _height, _type, _filter, _wrap, _autoclear);

    clear();

    // Set everything to 0
    m_flag = 0;
    swap();
}